

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

int av1_get_deltaq_offset(aom_bit_depth_t bit_depth,int qindex,double beta)

{
  int16_t iVar1;
  int iVar2;
  int iVar3;
  int in_ESI;
  double in_XMM0_Qa;
  double dVar4;
  double dVar5;
  int orig_qindex;
  int newq;
  int q;
  aom_bit_depth_t in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int local_c;
  int local_4;
  
  iVar1 = av1_dc_quant_QTX(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                           in_stack_ffffffffffffffc8);
  iVar2 = (int)iVar1;
  dVar4 = (double)iVar2;
  dVar5 = sqrt(in_XMM0_Qa);
  dVar5 = rint(dVar4 / dVar5);
  iVar3 = (int)dVar5;
  if (iVar3 == iVar2) {
    local_4 = 0;
  }
  else {
    local_c = in_ESI;
    if (iVar3 < iVar2) {
      do {
        if (local_c < 1) break;
        local_c = local_c + -1;
        iVar1 = av1_dc_quant_QTX(SUB84(dVar4,0),in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
        ;
      } while (iVar3 < iVar1);
    }
    else {
      do {
        if (0xfe < local_c) break;
        local_c = local_c + 1;
        iVar1 = av1_dc_quant_QTX(SUB84(dVar4,0),in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
        ;
      } while (iVar1 < iVar3);
    }
    local_4 = local_c - in_ESI;
  }
  return local_4;
}

Assistant:

int av1_get_deltaq_offset(aom_bit_depth_t bit_depth, int qindex, double beta) {
  assert(beta > 0.0);
  int q = av1_dc_quant_QTX(qindex, 0, bit_depth);
  int newq = (int)rint(q / sqrt(beta));
  int orig_qindex = qindex;
  if (newq == q) {
    return 0;
  }
  if (newq < q) {
    while (qindex > 0) {
      qindex--;
      q = av1_dc_quant_QTX(qindex, 0, bit_depth);
      if (newq >= q) {
        break;
      }
    }
  } else {
    while (qindex < MAXQ) {
      qindex++;
      q = av1_dc_quant_QTX(qindex, 0, bit_depth);
      if (newq <= q) {
        break;
      }
    }
  }
  return qindex - orig_qindex;
}